

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_value.c
# Opt level: O3

int mpt_print_value(mpt_value *val,_func_ssize_t_void_ptr_char_ptr_size_t *save,void *dest)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ssize_t sVar4;
  mpt_type_traits *pmVar5;
  size_t sVar6;
  ssize_t sVar7;
  ulong uVar8;
  uint uVar9;
  undefined8 *puVar10;
  void *ptr;
  size_t len;
  mpt_value pos;
  char buf [256];
  undefined8 *local_180;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  undefined8 *local_160;
  ulong local_158;
  size_t local_150;
  mpt_value local_148;
  char local_138 [264];
  
  local_180 = (undefined8 *)val->_addr;
  if (local_180 == (undefined8 *)0x0) {
    return -2;
  }
  iVar1 = (int)val->_type;
  if (iVar1 == 0x80) {
    if ((mpt_convertable *)*local_180 != (mpt_convertable *)0x0) {
      iVar1 = mpt_print_convertable((mpt_convertable *)*local_180,save,dest);
      return iVar1;
    }
  }
  else {
    if (iVar1 != 0x84) {
      pcVar3 = mpt_data_tostring(&local_180,(long)iVar1,&local_150);
      if (pcVar3 == (char *)0x0) {
        uVar9 = iVar1 + 0x20U & 0xff;
        if (uVar9 != 0 && 0xffffffe5 < iVar1 - 0x5aU) {
          pmVar5 = mpt_type_traits((ulong)uVar9);
          puVar10 = local_180;
          if (pmVar5 == (mpt_type_traits *)0x0) {
            return -3;
          }
          if (pmVar5->size == 0) {
            return -3;
          }
          local_168 = (ulong)uVar9;
          sVar4 = (*save)(dest,"[ ",2);
          iVar1 = (int)sVar4;
          if (iVar1 < 2) {
            return -0x11;
          }
          if (puVar10 != (undefined8 *)0x0) {
            local_170 = pmVar5->size;
            local_178 = (ulong)puVar10[1] / local_170;
            if (local_170 <= (ulong)puVar10[1]) {
              puVar10 = (undefined8 *)*puVar10;
              uVar8 = 0;
              do {
                local_158 = uVar8;
                if (uVar9 == 0x73) {
                  pcVar3 = (char *)*puVar10;
                  if (pcVar3 == (char *)0x0) {
                    iVar2 = 0;
                    pcVar3 = "";
                  }
                  else {
                    sVar6 = strlen(pcVar3);
                    iVar2 = (int)sVar6;
                  }
                }
                else {
                  local_148._type = local_168;
                  pcVar3 = local_138;
                  local_148._addr = puVar10;
                  iVar2 = mpt_number_tostring(&local_148,(mpt_value_format)0x0,pcVar3,0x100);
                  if (iVar2 < 0) {
                    return iVar2;
                  }
                }
                local_160 = puVar10;
                sVar4 = (*save)(dest,pcVar3,(long)iVar2);
                if ((int)sVar4 < iVar2) {
                  return -0x11;
                }
                sVar7 = (*save)(dest," ",1);
                if ((int)sVar7 < 1) {
                  return -0x11;
                }
                iVar1 = iVar1 + (int)sVar4 + (int)sVar7;
                puVar10 = (undefined8 *)((long)local_160 + local_170);
                uVar8 = local_158 + 1;
              } while (uVar8 < local_178);
            }
          }
          sVar4 = (*save)(dest,"]",1);
          if (-1 < (int)sVar4) {
            return iVar1 + (int)sVar4;
          }
          return -0x11;
        }
        uVar9 = mpt_number_tostring(val,(mpt_value_format)0x0,local_138,0x100);
        if ((int)uVar9 < 0) {
          return uVar9;
        }
        local_150 = (size_t)uVar9;
        pcVar3 = local_138;
      }
      sVar4 = (*save)(dest,pcVar3,local_150);
      return (int)sVar4;
    }
    if ((mpt_object *)*local_180 != (mpt_object *)0x0) {
      iVar1 = mpt_print_object((mpt_object *)*local_180,save,dest);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

extern int mpt_print_value(const MPT_STRUCT(value) *val, ssize_t (*save)(void *, const char *, size_t), void *dest)
{
	static const MPT_STRUCT(value_format) vfmt = MPT_VALFMT_INIT;
	const void *ptr;
	const char *str;
	size_t len;
	int type, curr, adv;
	char buf[256];
	
	/* missing content */
	if (!(ptr = val->_addr)) {
		return MPT_ERROR(BadValue);
	}
	/* object type */
	type = val->_type;
	if (type == MPT_ENUM(TypeObjectPtr)) {
		const MPT_INTERFACE(object) *obj = *(const void **) ptr;
		return obj ? mpt_print_object(obj, save, dest) : 0;
	}
	/* convertable type */
	if (type == MPT_ENUM(TypeConvertablePtr)) {
		MPT_INTERFACE(convertable) *conv = *(void **) ptr;
		return conv ? mpt_print_convertable(conv, save, dest) : 0;
	}
	if ((str = mpt_data_tostring(&ptr, type, &len))) {
		return save(dest, str, len);
	}
	/* vector representation in value */
	if ((curr = MPT_type_toScalar(type)) > 0) {
		const MPT_STRUCT(type_traits) *traits = mpt_type_traits(curr);
		const struct iovec *vec = ptr;
		int total;
		if (!traits || !traits->size) {
			return MPT_ERROR(BadType);
		}
		if ((total = save(dest, "[ ", 2)) < 2) {
			return MPT_ERROR(MissingBuffer);
		}
		if (vec) {
			const uint8_t *data = vec->iov_base;
			size_t i, size = traits->size, max = vec->iov_len / size;
			
			for (i = 0; i < max; i++) {
				const char *str;
				int step;
				if (curr == 's') {
					if ((str = *((const char **) data))) {
						adv = strlen(str);
					}
					else {
						adv = 0;
						str = "";
					}
				}
				else {
					MPT_STRUCT(value) pos = MPT_VALUE_INIT(curr, data);
					adv = mpt_number_tostring(&pos, vfmt, buf, sizeof(buf));
					if (adv < 0) {
						return adv;
					}
					str = buf;
				}
				if ((step = save(dest, str, adv)) < adv) {
					return MPT_ERROR(MissingBuffer);
				}
				total += step;
				if ((step = save(dest, " ", 1)) < 1) {
					return MPT_ERROR(MissingBuffer);
				}
				total += step;
				data  += size;
			}
		}
		if ((adv = save(dest, "]", 1)) < 0) {
			return MPT_ERROR(MissingBuffer);
		}
		return total + adv;
	}
	/* represent numeric value */
	if ((adv = mpt_number_tostring(val, vfmt, buf, sizeof(buf))) >= 0) {
		return save(dest, buf, adv);
	}
	return adv;
}